

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TeamCityReporter::printSectionHeader(TeamCityReporter *this,ostream *os)

{
  pointer pSVar1;
  pointer pSVar2;
  SourceLineInfo lineInfo;
  
  pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar2 != pSVar1) {
    if (1 < (ulong)(((long)pSVar1 - (long)pSVar2) / 0x30)) {
      Catch::operator<<(os,(lineOfChars)0x2d);
      std::operator<<(os,'\n');
      pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (pSVar2 = pSVar2 + 1, pSVar2 != pSVar1) {
        std::__cxx11::string::find((char *)pSVar2,0x25c1e7);
        TextFlow::Column::Column((Column *)&lineInfo,&pSVar2->name);
        TextFlow::operator<<(os,(Column *)&lineInfo);
        std::operator<<(os,'\n');
        std::__cxx11::string::~string((string *)&lineInfo);
      }
      Catch::operator<<(os,(lineOfChars)0x2d);
      std::operator<<(os,'\n');
      pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    lineInfo.file = (pSVar2->lineInfo).file;
    lineInfo.line = (pSVar2->lineInfo).line;
    Catch::operator<<(os,&lineInfo);
    std::operator<<(os,'\n');
    Catch::operator<<(os,(lineOfChars)0x2e);
    std::operator<<(os,"\n\n");
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0x28d6,"void Catch::TeamCityReporter::printSectionHeader(std::ostream &)");
}

Assistant:

IEventListenerPtr createReporter(std::string const& reporterName, ReporterConfig&& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, CATCH_MOVE(config));
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << '\'');

            return reporter;
        }